

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<float>_*>::Resize(TPZVec<TPZEqnArray<float>_*> *this,int64_t newsize)

{
  TPZEqnArray<float> **ppTVar1;
  ostream *poVar2;
  TPZEqnArray<float> **ppTVar3;
  long lVar4;
  long lVar5;
  
  if (newsize < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      if (this->fStore != (TPZEqnArray<float> **)0x0) {
        operator_delete__(this->fStore);
      }
      this->fStore = (TPZEqnArray<float> **)0x0;
    }
    else {
      lVar5 = 0;
      ppTVar3 = (TPZEqnArray<float> **)
                operator_new__(-(ulong)((ulong)newsize >> 0x3d != 0) | newsize * 8);
      if (newsize <= lVar4) {
        lVar4 = newsize;
      }
      ppTVar1 = this->fStore;
      if (lVar4 < 1) {
        lVar4 = lVar5;
      }
      for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        ppTVar3[lVar5] = ppTVar1[lVar5];
      }
      if (ppTVar1 != (TPZEqnArray<float> **)0x0) {
        operator_delete__(ppTVar1);
      }
      this->fStore = ppTVar3;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}